

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O1

int output_bin(char *fname,int length)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  
  __stream = fopen(fname,"wb");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    if (0 < length) {
      uVar2 = 0;
      do {
        fputc((uint)ebuf[uVar2],__stream);
        uVar2 = uVar2 + 1;
      } while ((uint)length != uVar2);
    }
    fclose(__stream);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int output_bin(char *fname, int length)
{
   FILE *fp;
 
   int cc;

   fp = fopen(fname, "wb");
   if(fp == NULL) 
      return 0;
   for (cc = 0 ; cc < length ; cc++)
      fputc( ebuf[cc], fp);
   fclose(fp);
   
   return 1;
}